

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckDecimal(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  Bool BVar2;
  char *pcVar3;
  
  pcVar3 = attval->value;
  if ((*pcVar3 == '-') || (*pcVar3 == '+')) {
    pcVar3 = pcVar3 + 1;
  }
  while ((cVar1 = *pcVar3, cVar1 != '\0' && (cVar1 != '.'))) {
    BVar2 = prvTidyIsDigit((int)cVar1);
    pcVar3 = pcVar3 + 1;
    if (BVar2 == no) {
      prvTidyReportAttrError(doc,node,attval,0x22b);
      return;
    }
  }
  return;
}

Assistant:

static void CheckDecimal( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    Bool hasPoint = no;

    p  = attval->value;

    /* Allow leading sign */
    if (*p == '+' || *p == '-')
        ++p;

    while (*p)
    {
        /* Allow a single decimal point */
        if (*p == '.')
        {
            if (!hasPoint)
                hasPoint = yes;
            else
                TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                break;
        }
        
        if (!TY_(IsDigit)(*p))
        {
            TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
            break;
        }
        ++p;
    }
}